

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

bool Guest_ContactHost(void *userdata)

{
  int iVar1;
  sockaddr_in *address;
  _func_int **pp_Var2;
  ulong uVar3;
  char *error;
  bool bVar4;
  PreGamePacket packet;
  undefined2 local_6c;
  byte local_6a;
  byte local_69;
  
  local_6c = 0x30;
  sendto(mysocket,&local_6c,2,0,(sockaddr *)(sendaddress + 1),0x10);
  address = PreGet(&local_6c,0x44,true);
  bVar4 = address != (sockaddr_in *)0x0;
  if (bVar4) {
    do {
      if ((char)local_6c == '0') {
        iVar1 = FindNode(address);
        if (iVar1 == 1) {
          error = "The host cancelled the game.";
          if (local_6c._1_1_ != '\x02') {
            if (local_6c._1_1_ != '\x05') {
              if (local_6c._1_1_ != '\x04') goto LAB_004bea18;
              (*StartScreen->_vptr_FStartupScreen[7])
                        (StartScreen,"Total players: %d",(ulong)local_6a);
              (*StartScreen->_vptr_FStartupScreen[5])
                        (StartScreen,"Waiting for other players",(ulong)local_6a);
              uVar3 = (ulong)local_69;
              pp_Var2 = StartScreen->_vptr_FStartupScreen;
              goto LAB_004bea41;
            }
            error = "The game is full.";
          }
          doomcom.numnodes = 0;
          I_FatalError(error);
        }
      }
LAB_004bea18:
      address = PreGet(&local_6c,0x44,true);
      bVar4 = address != (sockaddr_in *)0x0;
    } while (bVar4);
  }
  pp_Var2 = StartScreen->_vptr_FStartupScreen;
  uVar3 = 0;
LAB_004bea41:
  (*pp_Var2[6])(StartScreen,uVar3);
  return bVar4;
}

Assistant:

bool Guest_ContactHost (void *userdata)
{
	sockaddr_in *from;
	PreGamePacket packet;

	// Let the host know we are here.
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_CONNECT;
	PreSend (&packet, 2, &sendaddress[1]);

	// Listen for a reply.
	while ( (from = PreGet (&packet, sizeof(packet), true)) )
	{
		if (packet.Fake == PRE_FAKE && FindNode(from) == 1)
		{
			if (packet.Message == PRE_CONACK)
			{
				StartScreen->NetMessage ("Total players: %d", packet.NumNodes);
				StartScreen->NetInit ("Waiting for other players", packet.NumNodes);
				StartScreen->NetProgress (packet.NumPresent);
				return true;
			}
			else if (packet.Message == PRE_DISCONNECT)
			{
				doomcom.numnodes = 0;
				I_FatalError ("The host cancelled the game.");
			}
			else if (packet.Message == PRE_ALLFULL)
			{
				doomcom.numnodes = 0;
				I_FatalError ("The game is full.");
			}
		}
	}

	// In case the progress bar could not be marqueed, bump it.
	StartScreen->NetProgress (0);

	return false;
}